

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseSession.cpp:376:29)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  ApplicationSession *pAVar2;
  type handler;
  ptr local_70;
  undefined8 local_58;
  func_type local_50;
  uint64_t uStack_48;
  scheduler_operation *psStack_40;
  func_type p_Stack_38;
  uint local_30;
  data_union local_2c;
  ApplicationSession *local_10;
  
  local_70.h = (type *)&local_58;
  local_58 = base[1].next_;
  local_30 = base[2].task_result_;
  local_50 = base[1].func_;
  uStack_48 = *(uint64_t *)&base[1].task_result_;
  psStack_40 = base[2].next_;
  p_Stack_38 = base[2].func_;
  local_2c._0_8_ = *(undefined8 *)&base[2].field_0x14;
  local_2c._20_8_ = *(undefined8 *)&base[3].task_result_;
  local_2c._8_4_ = (undefined4)*(undefined8 *)((long)&base[3].next_ + 4);
  local_2c._12_4_ = SUB84(base[3].func_,0);
  local_2c._16_4_ = (undefined4)((ulong)base[3].func_ >> 0x20);
  local_10 = (ApplicationSession *)base[4].next_;
  local_70.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseSession_cpp:376:29)>
                *)base;
  local_70.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseSession_cpp:376:29)>
                *)base;
  ptr::reset(&local_70);
  pAVar2 = local_10;
  if (owner != (void *)0x0) {
    tonk::ApplicationSession::onP2PStartConnect
              (local_10,(uint16_t)local_58,local_58._4_4_,(P2PConnectParams *)&local_50);
    LOCK();
    paVar1 = &(pAVar2->SelfRefCount).RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
  }
  ptr::~ptr(&local_70);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }